

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O3

int xmlShellList(xmlShellCtxtPtr ctxt,char *arg,xmlNodePtr node,xmlNodePtr node2)

{
  xmlElementType xVar1;
  _xmlNode *node_00;
  
  if (ctxt != (xmlShellCtxtPtr)0x0) {
    if (node == (xmlNodePtr)0x0) {
      fwrite("NULL\n",5,1,(FILE *)ctxt->output);
    }
    else {
      xVar1 = node->type;
      if ((xVar1 == XML_DOCUMENT_NODE) || (xVar1 == XML_HTML_DOCUMENT_NODE)) {
        node_00 = node->children;
        goto LAB_0013ef96;
      }
      if ((xVar1 == XML_NAMESPACE_DECL) || (node_00 = node->children, node_00 == (_xmlNode *)0x0)) {
        xmlLsOneNode(ctxt->output,node);
      }
      else {
        do {
          xmlLsOneNode(ctxt->output,node_00);
          node_00 = node_00->next;
LAB_0013ef96:
        } while (node_00 != (_xmlNode *)0x0);
      }
    }
  }
  return 0;
}

Assistant:

int
xmlShellList(xmlShellCtxtPtr ctxt,
             char *arg ATTRIBUTE_UNUSED, xmlNodePtr node,
             xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    xmlNodePtr cur;
    if (!ctxt)
        return (0);
    if (node == NULL) {
	fprintf(ctxt->output, "NULL\n");
	return (0);
    }
    if ((node->type == XML_DOCUMENT_NODE) ||
        (node->type == XML_HTML_DOCUMENT_NODE)) {
        cur = ((xmlDocPtr) node)->children;
    } else if (node->type == XML_NAMESPACE_DECL) {
        xmlLsOneNode(ctxt->output, node);
        return (0);
    } else if (node->children != NULL) {
        cur = node->children;
    } else {
        xmlLsOneNode(ctxt->output, node);
        return (0);
    }
    while (cur != NULL) {
        xmlLsOneNode(ctxt->output, cur);
        cur = cur->next;
    }
    return (0);
}